

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

string * __thiscall
helics::Filter::getString_abi_cxx11_
          (string *__return_storage_ptr__,Filter *this,string_view property)

{
  element_type *peVar1;
  
  peVar1 = (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (*peVar1->_vptr_FilterOperations[5])
              (__return_storage_ptr__,peVar1,property._M_len,property._M_str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Filter::getString(std::string_view property)
{
    if (filtOp) {
        return filtOp->getString(property);
    }
    return {};
}